

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O2

void __thiscall
QSharedDataPointer<QOcspResponsePrivate>::detach_helper
          (QSharedDataPointer<QOcspResponsePrivate> *this)

{
  int *piVar1;
  QOcspResponsePrivate *this_00;
  int iVar2;
  undefined4 extraout_var;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  void *in_R8;
  int *piVar3;
  
  iVar2 = clone(this,in_RSI,in_RDX,in_ECX,in_R8);
  piVar3 = (int *)CONCAT44(extraout_var,iVar2);
  LOCK();
  *piVar3 = *piVar3 + 1;
  UNLOCK();
  piVar1 = *(int **)this;
  LOCK();
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    this_00 = *(QOcspResponsePrivate **)this;
    if (this_00 != (QOcspResponsePrivate *)0x0) {
      QOcspResponsePrivate::~QOcspResponsePrivate(this_00);
    }
    operator_delete(this_00,0x20);
  }
  *(int **)this = piVar3;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}